

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

int __thiscall storage::BTLeafNode::erase_(BTLeafNode *this,int key,Record **out_record,bool *out)

{
  int iVar1;
  bool bVar2;
  BTNode *pBVar3;
  int *local_c8;
  BTLeafNode *local_b8;
  int local_a0;
  int i_2;
  int idx_1;
  bool a_3;
  int iStack_90;
  bool a_2;
  int i_1;
  int idx;
  bool a_1;
  Record *rec;
  Record *record_move_1;
  int *piStack_70;
  int key_move_1;
  int *key_infl_1;
  Record *pRStack_60;
  bool a;
  Record *record_move;
  int *piStack_50;
  int key_move;
  int *key_infl;
  BTLeafNode *r;
  BTLeafNode *l;
  int i;
  int index;
  bool *out_local;
  Record **out_record_local;
  BTLeafNode *pBStack_18;
  int key_local;
  BTLeafNode *this_local;
  
  *out = true;
  l._4_4_ = -1;
  _i = out;
  out_local = (bool *)out_record;
  out_record_local._4_4_ = key;
  pBStack_18 = this;
  bVar2 = search_record(this,key,out_record,(int *)((long)&l + 4));
  if (bVar2) {
    bVar2 = BTNode::check_if_erase(&this->super_BTNode);
    if ((bVar2) || ((this->super_BTNode).parent_ == (BTNode *)0x0)) {
      while (l._0_4_ = l._4_4_ + 1, (int)l < (this->super_BTNode).used_links_count_ + -1) {
        (this->super_BTNode).keys_[l._4_4_] = (this->super_BTNode).keys_[(int)l];
        this->record_links_[l._4_4_] = this->record_links_[(int)l];
        l._4_4_ = (int)l;
      }
      (this->super_BTNode).used_links_count_ = (this->super_BTNode).used_links_count_ + -1;
    }
    else {
      pBVar3 = BTNode::get_left_brother(&this->super_BTNode);
      if (pBVar3 == (BTNode *)0x0) {
        local_b8 = (BTLeafNode *)0x0;
      }
      else {
        local_b8 = (BTLeafNode *)__dynamic_cast(pBVar3,&BTNode::typeinfo,&typeinfo,0);
      }
      r = local_b8;
      pBVar3 = BTNode::get_right_brother(&this->super_BTNode);
      if (pBVar3 == (BTNode *)0x0) {
        local_c8 = (int *)0x0;
      }
      else {
        local_c8 = (int *)__dynamic_cast(pBVar3,&BTNode::typeinfo,&typeinfo,0);
      }
      key_infl = local_c8;
      if ((r == (BTLeafNode *)0x0) || (bVar2 = BTNode::check_if_erase(&r->super_BTNode), !bVar2)) {
        if ((key_infl == (int *)0x0) || (bVar2 = BTNode::check_if_erase((BTNode *)key_infl), !bVar2)
           ) {
          if (r != (BTLeafNode *)0x0) {
            iStack_90 = (this->super_BTNode).child_index_ + -1;
            idx_1 = 0;
            do {
              if ((this->super_BTNode).used_links_count_ + -1 <= idx_1) {
                r->next_ = this->next_;
                return iStack_90;
              }
              if ((this->super_BTNode).keys_[idx_1] != out_record_local._4_4_) {
                i_2._3_1_ = 0;
                insert_(r,(this->super_BTNode).keys_[idx_1],this->record_links_[idx_1],
                        (bool *)((long)&i_2 + 3));
                if ((i_2._3_1_ & 1) == 0) {
                  __assert_fail("a",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                                ,0x200,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
                }
              }
              idx_1 = idx_1 + 1;
            } while( true );
          }
          if (key_infl != (int *)0x0) {
            i_2._2_1_ = 0;
            iVar1 = (this->super_BTNode).child_index_;
            insert_(this,key_infl[5],*(Record **)(key_infl + 0x38),(bool *)((long)&i_2 + 2));
            if ((i_2._2_1_ & 1) == 0) {
              __assert_fail("a",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                            ,0x208,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
            }
            erase_(this,out_record_local._4_4_,(Record **)out_local,_i);
            local_a0 = 1;
            while( true ) {
              if (key_infl[0x37] + -1 <= local_a0) {
                this->next_ = *(BTLeafNode **)(key_infl + 0x9c);
                return iVar1;
              }
              insert_(this,key_infl[(long)local_a0 + 5],
                      *(Record **)(key_infl + (long)local_a0 * 2 + 0x38),(bool *)((long)&i_2 + 2));
              if ((i_2._2_1_ & 1) == 0) break;
              local_a0 = local_a0 + 1;
            }
            __assert_fail("a",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                          ,0x20c,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
          }
          if ((this->super_BTNode).parent_ != (BTNode *)0x0) {
            __assert_fail("parent_ == nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                          ,0x212,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
          }
        }
        else {
          piStack_70 = ((this->super_BTNode).parent_)->keys_ + (this->super_BTNode).child_index_;
          record_move_1._4_4_ = key_infl[5];
          rec = *(Record **)(key_infl + 0x38);
          _idx = (Record *)0x0;
          i_1._3_1_ = 0;
          erase_((BTLeafNode *)key_infl,record_move_1._4_4_,(Record **)&idx,(bool *)((long)&i_1 + 3)
                );
          if ((i_1._3_1_ & 1) == 0) {
            __assert_fail("a",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                          ,0x1f2,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
          }
          insert_(this,record_move_1._4_4_,rec,(bool *)((long)&i_1 + 3));
          if ((i_1._3_1_ & 1) == 0) {
            __assert_fail("a",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                          ,0x1f5,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
          }
          erase_(this,out_record_local._4_4_,(Record **)out_local,_i);
          *piStack_70 = key_infl[5];
        }
      }
      else {
        piStack_50 = ((this->super_BTNode).parent_)->keys_ +
                     ((this->super_BTNode).child_index_ + -1);
        record_move._4_4_ = (r->super_BTNode).keys_[(r->super_BTNode).used_links_count_ + -2];
        pRStack_60 = r->record_links_[(r->super_BTNode).used_links_count_ + -2];
        key_infl_1._7_1_ = 0;
        insert_(this,record_move._4_4_,pRStack_60,(bool *)((long)&key_infl_1 + 7));
        if ((key_infl_1._7_1_ & 1) == 0) {
          __assert_fail("a",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                        ,0x1e4,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
        }
        erase_(r,record_move._4_4_,(Record **)out_local,(bool *)((long)&key_infl_1 + 7));
        if ((key_infl_1._7_1_ & 1) == 0) {
          __assert_fail("a",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                        ,0x1e6,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
        }
        erase_(this,out_record_local._4_4_,(Record **)out_local,_i);
        *piStack_50 = record_move._4_4_;
      }
    }
  }
  else {
    *_i = false;
  }
  return -1;
}

Assistant:

int BTLeafNode::erase_(int key, Record *&out_record, bool &out) {
        out = true;
        int index = -1;
        if (search_record(key, out_record, index)) {
            if (check_if_erase() || (parent_ == nullptr))               //only need erase
            {
                for (int i = index + 1; i < used_links_count_ - 1; ++i) {
                    keys_[i - 1] = keys_[i];
                    record_links_[i - 1] = record_links_[i];
                }
                used_links_count_--;
            } else {
                BTLeafNode *l = dynamic_cast<BTLeafNode *>(get_left_brother());
                BTLeafNode *r = dynamic_cast<BTLeafNode *>(get_right_brother());
                if (l && l->check_if_erase()) {
                    // move one from left brother
                    int &key_infl = parent_->keys_[child_index_ - 1];

                    int key_move = l->keys_[l->used_links_count_ - 2];
                    Record *record_move = l->record_links_[l->used_links_count_ - 2];

                    bool a = false;
                    insert_(key_move, record_move, a);
                    assert(a);
                    l->erase_(key_move, out_record, a);
                    assert(a);
                    erase_(key, out_record, out);
                    key_infl = key_move;
                } else if (r && r->check_if_erase()) {
                    // move one from right brother
                    int &key_infl = parent_->keys_[child_index_];

                    int key_move = r->keys_[0];
                    Record *record_move = r->record_links_[0];
                    Record *rec = nullptr;
                    bool a = false;
                    r->erase_(key_move, rec, a);
                    assert(a);

                    insert_(key_move, record_move, a);
                    assert(a);
                    erase_(key, out_record, out);
                    key_infl = r->keys_[0];
                } else {
                    if (l) {
                        int idx = child_index_ - 1;
                        for (int i = 0; i < used_links_count_ - 1; ++i) {
                            if (keys_[i] == key)
                                continue;
                            bool a = false;
                            l->insert_(keys_[i], record_links_[i], a);
                            assert(a);
                        }
                        l->next_ = this->next_;
                        return idx;
                    } else if (r) {
                        bool a = false;
                        int idx = child_index_;
                        insert_(r->keys_[0], r->record_links_[0], a);
                        assert(a);
                        erase_(key, out_record, out);
                        for (int i = 1; i < r->used_links_count_ - 1; ++i) {
                            insert_(r->keys_[i], r->record_links_[i], a);
                            assert(a);
                        }
                        this->next_ = r->next_;
                        return idx;
                    } else {
                        // this must be a root
                        assert(parent_ == nullptr);
                    }
                }
            }
        } else {
            out = false;
        }
        return -1;
    }